

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseMemoryModuleField(WastParser *this,Module *module)

{
  bool bVar1;
  Result result;
  pointer pMVar2;
  pointer pDVar3;
  ExprList *this_00;
  reference pvVar4;
  ulong uVar5;
  pointer pMVar6;
  size_type sVar7;
  unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> local_200;
  Enum local_1f4;
  unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> local_1f0;
  unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> field_1;
  unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> local_1e0;
  uint local_1d8;
  uint local_1d4;
  uint32_t page_size;
  uint32_t byte_size;
  unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> memory_field;
  Location local_1c0;
  Const local_1a0;
  unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> local_168;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_160;
  Location local_158;
  Var local_138;
  DataSegment *local_f0;
  DataSegment *data_segment;
  unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  data_segment_field;
  Location local_d8;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_b8;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> field;
  unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> local_a8;
  unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> import;
  undefined1 local_98 [8];
  ModuleFieldList export_fields;
  undefined1 local_70 [8];
  string name;
  undefined1 auStack_48 [8];
  Location loc;
  Module *module_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    GetLocation((Location *)auStack_48,this);
    name.field_2._12_4_ = Expect(this,Memory);
    bVar1 = Failed((Result)name.field_2._12_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      std::__cxx11::string::string((string *)local_70);
      ParseBindVarOpt(this,(string *)local_70);
      intrusive_list<wabt::ModuleField>::intrusive_list
                ((intrusive_list<wabt::ModuleField> *)local_98);
      import._M_t.
      super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
      super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
      super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._4_4_ =
           ParseInlineExports(this,(ModuleFieldList *)local_98,Memory);
      bVar1 = Failed(import._M_t.
                     super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>
                     .super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._4_4_);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        import._M_t.
        super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
        super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
      }
      else {
        bVar1 = PeekMatchLpar(this,Import);
        if (bVar1) {
          CheckImportOrdering(this,module);
          MakeUnique<wabt::MemoryImport,std::__cxx11::string&>
                    ((wabt *)&local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
          pMVar2 = std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::
                   get(&local_a8);
          field._M_t.
          super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
          ._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._4_4_ =
               ParseInlineImport(this,(Import *)pMVar2);
          bVar1 = Failed(field._M_t.
                         super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._4_4_
                        );
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t
            .super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
            super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            pMVar2 = std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::
                     operator->(&local_a8);
            field._M_t.
            super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
            ._M_t.
            super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
            .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._0_4_ =
                 ParseLimits(this,&(pMVar2->memory).page_limits);
            bVar1 = Failed(field._M_t.
                           super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                           .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl.
                           _0_4_);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              import._M_t.
              super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>.
              _M_t.
              super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>
              .super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
            }
            else {
              GetLocation(&local_d8,this);
              MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>>,wabt::Location>
                        ((wabt *)&local_b8,&local_a8,&local_d8);
              std::
              unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
              unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                          *)&data_segment_field,&local_b8);
              Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                          *)&data_segment_field);
              std::
              unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
              ~unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                           *)&data_segment_field);
              std::
              unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
              ~unique_ptr(&local_b8);
              import._M_t.
              super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>.
              _M_t.
              super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>
              .super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 0;
            }
          }
          std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::~unique_ptr
                    (&local_a8);
        }
        else {
          bVar1 = MatchLpar(this,Data);
          if (bVar1) {
            MakeUnique<wabt::DataSegmentModuleField,wabt::Location&>
                      ((wabt *)&data_segment,(Location *)auStack_48);
            pDVar3 = std::
                     unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                     ::operator->((unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                   *)&data_segment);
            local_f0 = &pDVar3->data_segment;
            sVar7 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::size
                              (&module->memories);
            Location::Location(&local_158);
            Var::Var(&local_138,(Index)sVar7,&local_158);
            Var::operator=(&local_f0->memory_var,&local_138);
            Var::~Var(&local_138);
            this_00 = &local_f0->offset;
            Location::Location(&local_1c0);
            Const::I32(&local_1a0,0,&local_1c0);
            MakeUnique<wabt::ConstExpr,wabt::Const>((wabt *)&local_168,&local_1a0);
            std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
            unique_ptr<wabt::ConstExpr,std::default_delete<wabt::ConstExpr>,void>
                      ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_160,
                       &local_168);
            intrusive_list<wabt::Expr>::push_back(this_00,&local_160);
            std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_160);
            std::unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_>::~unique_ptr
                      (&local_168);
            pvVar4 = intrusive_list<wabt::Expr>::back(&local_f0->offset);
            (pvVar4->loc).field_1.field_1.offset = loc.filename.size_;
            ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
            ((long)&(pvVar4->loc).field_1 + 8))->offset = (size_t)loc.field_1.field_1.offset;
            (pvVar4->loc).filename.data_ = (char *)auStack_48;
            (pvVar4->loc).filename.size_ = (size_type)loc.filename.data_;
            ParseTextListOpt(this,&local_f0->data);
            memory_field._M_t.
            super___uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
            ._M_t.
            super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
            .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl._4_4_ =
                 Expect(this,Rpar);
            bVar1 = Failed(memory_field._M_t.
                           super___uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                           .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl.
                           _4_4_);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
            }
            else {
              MakeUnique<wabt::MemoryModuleField,wabt::Location&,std::__cxx11::string&>
                        ((wabt *)&page_size,(Location *)auStack_48,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70);
              sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                (&local_f0->data);
              local_1d8 = (int)sVar7 + 0xffff;
              local_1d4 = local_1d8 & 0xffff0000;
              local_1d8 = local_1d8 >> 0x10;
              uVar5 = (ulong)local_1d8;
              pMVar6 = std::
                       unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                       ::operator->((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                     *)&page_size);
              (pMVar6->memory).page_limits.initial = uVar5;
              uVar5 = (ulong)local_1d8;
              pMVar6 = std::
                       unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                       ::operator->((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                     *)&page_size);
              (pMVar6->memory).page_limits.max = uVar5;
              pMVar6 = std::
                       unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                       ::operator->((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                     *)&page_size);
              (pMVar6->memory).page_limits.has_max = true;
              std::
              unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
              unique_ptr(&local_1e0,
                         (unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                          *)&page_size);
              Module::AppendField(module,&local_1e0);
              std::
              unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
              ~unique_ptr(&local_1e0);
              std::
              unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
              ::unique_ptr((unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                            *)&field_1,
                           (unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                            *)&data_segment);
              Module::AppendField(module,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                          *)&field_1);
              std::
              unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
              ::~unique_ptr((unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                             *)&field_1);
              std::
              unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
              ~unique_ptr((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                           *)&page_size);
            }
            import._M_t.
            super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t
            .super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
            super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._1_3_ = 0;
            import._M_t.
            super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t
            .super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
            super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_1_ = bVar1;
            std::
            unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
            ::~unique_ptr((unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                           *)&data_segment);
          }
          else {
            MakeUnique<wabt::MemoryModuleField,wabt::Location&,std::__cxx11::string&>
                      ((wabt *)&local_1f0,(Location *)auStack_48,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                      );
            pMVar6 = std::
                     unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                     ::operator->(&local_1f0);
            local_1f4 = (Enum)ParseLimits(this,&(pMVar6->memory).page_limits);
            bVar1 = Failed((Result)local_1f4);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
            }
            else {
              std::
              unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
              unique_ptr(&local_200,&local_1f0);
              Module::AppendField(module,&local_200);
              std::
              unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
              ~unique_ptr(&local_200);
            }
            import._M_t.
            super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t
            .super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
            super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._1_3_ = 0;
            import._M_t.
            super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t
            .super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
            super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_1_ = bVar1;
            std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
            ::~unique_ptr(&local_1f0);
          }
        }
        if ((uint)import._M_t.
                  super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>
                  .super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl == 0) {
          sVar7 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::size
                            (&module->memories);
          anon_unknown_1::AppendInlineExportFields
                    (module,(ModuleFieldList *)local_98,(int)sVar7 - 1);
          result = Expect(this,Rpar);
          bVar1 = Failed(result);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t
            .super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
            super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            Result::Result((Result *)((long)&this_local + 4),Ok);
            import._M_t.
            super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t
            .super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
            super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
          }
        }
      }
      intrusive_list<wabt::ModuleField>::~intrusive_list
                ((intrusive_list<wabt::ModuleField> *)local_98);
      std::__cxx11::string::~string((string *)local_70);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseMemoryModuleField(Module* module) {
  WABT_TRACE(ParseMemoryModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Memory);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Memory));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<MemoryImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimits(&import->memory.page_limits));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else if (MatchLpar(TokenType::Data)) {
    auto data_segment_field = MakeUnique<DataSegmentModuleField>(loc);
    DataSegment& data_segment = data_segment_field->data_segment;
    data_segment.memory_var = Var(module->memories.size());
    data_segment.offset.push_back(MakeUnique<ConstExpr>(Const::I32(0)));
    data_segment.offset.back().loc = loc;
    ParseTextListOpt(&data_segment.data);
    EXPECT(Rpar);

    auto memory_field = MakeUnique<MemoryModuleField>(loc, name);
    uint32_t byte_size = WABT_ALIGN_UP_TO_PAGE(data_segment.data.size());
    uint32_t page_size = WABT_BYTES_TO_PAGES(byte_size);
    memory_field->memory.page_limits.initial = page_size;
    memory_field->memory.page_limits.max = page_size;
    memory_field->memory.page_limits.has_max = true;

    module->AppendField(std::move(memory_field));
    module->AppendField(std::move(data_segment_field));
  } else {
    auto field = MakeUnique<MemoryModuleField>(loc, name);
    CHECK_RESULT(ParseLimits(&field->memory.page_limits));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->memories.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}